

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

int doh_done(Curl_easy *doh,CURLcode result)

{
  Curl_easy *data;
  dohdata *pdVar1;
  char *pcVar2;
  
  data = (doh->set).dohfor;
  pdVar1 = (data->req).doh;
  pdVar1->pending = pdVar1->pending - 1;
  Curl_infof(data,"a DoH request is completed, %u to go");
  if (result != CURLE_OK) {
    pcVar2 = curl_easy_strerror(result);
    Curl_infof(data,"DoH request %s",pcVar2);
  }
  if (pdVar1->pending == 0) {
    curl_slist_free_all(pdVar1->headers);
    pdVar1->headers = (curl_slist *)0x0;
    Curl_expire(data,0,EXPIRE_RUN_NOW);
  }
  return 0;
}

Assistant:

static int doh_done(struct Curl_easy *doh, CURLcode result)
{
  struct Curl_easy *data = doh->set.dohfor;
  struct dohdata *dohp = data->req.doh;
  /* so one of the DoH request done for the 'data' transfer is now complete! */
  dohp->pending--;
  infof(data, "a DoH request is completed, %u to go", dohp->pending);
  if(result)
    infof(data, "DoH request %s", curl_easy_strerror(result));

  if(!dohp->pending) {
    /* DoH completed */
    curl_slist_free_all(dohp->headers);
    dohp->headers = NULL;
    Curl_expire(data, 0, EXPIRE_RUN_NOW);
  }
  return 0;
}